

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_sof(j_decompress_ptr cinfo,boolean is_baseline,boolean is_prog,boolean is_arith)

{
  byte bVar1;
  byte bVar2;
  jpeg_source_mgr *pjVar3;
  jpeg_error_mgr *pjVar4;
  boolean bVar5;
  jpeg_component_info *pjVar6;
  int *_mp_1;
  int *_mp;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  jpeg_component_info *compptr;
  int ci;
  int c;
  INT32 length;
  boolean is_arith_local;
  boolean is_prog_local;
  boolean is_baseline_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->src;
  bytes_in_buffer = (size_t)pjVar3->next_input_byte;
  _mp = (int *)pjVar3->bytes_in_buffer;
  cinfo->is_baseline = is_baseline;
  cinfo->progressive_mode = is_prog;
  cinfo->arith_code = is_arith;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar3->next_input_byte;
    _mp = (int *)pjVar3->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  bVar1 = *(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar3->next_input_byte;
    _mp = (int *)pjVar3->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  bVar2 = *(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar3->next_input_byte;
    _mp = (int *)pjVar3->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  cinfo->data_precision = (uint)*(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar3->next_input_byte;
    _mp = (int *)pjVar3->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  cinfo->image_height = (uint)*(byte *)bytes_in_buffer << 8;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar3->next_input_byte;
    _mp = (int *)pjVar3->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  cinfo->image_height = (uint)*(byte *)bytes_in_buffer + cinfo->image_height;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar3->next_input_byte;
    _mp = (int *)pjVar3->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  cinfo->image_width = (uint)*(byte *)bytes_in_buffer << 8;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar3->next_input_byte;
    _mp = (int *)pjVar3->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  cinfo->image_width = (uint)*(byte *)bytes_in_buffer + cinfo->image_width;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar3->next_input_byte;
    _mp = (int *)pjVar3->bytes_in_buffer;
  }
  cinfo->num_components = (uint)*(byte *)bytes_in_buffer;
  pjVar4 = cinfo->err;
  (pjVar4->msg_parm).i[0] = cinfo->unread_marker;
  (pjVar4->msg_parm).i[1] = cinfo->image_width;
  (pjVar4->msg_parm).i[2] = cinfo->image_height;
  (pjVar4->msg_parm).i[3] = cinfo->num_components;
  cinfo->err->msg_code = 0x66;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  if (cinfo->marker->saw_SOF != 0) {
    cinfo->err->msg_code = 0x3c;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (((cinfo->image_height == 0) || (cinfo->image_width == 0)) || (cinfo->num_components < 1)) {
    cinfo->err->msg_code = 0x21;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if ((ulong)bVar2 + (ulong)bVar1 * 0x100 + -8 != (long)(cinfo->num_components * 3)) {
    cinfo->err->msg_code = 0xc;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->comp_info == (jpeg_component_info *)0x0) {
    pjVar6 = (jpeg_component_info *)
             (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components * 0x60);
    cinfo->comp_info = pjVar6;
  }
  compptr._0_4_ = 0;
  datasrc = (jpeg_source_mgr *)cinfo->comp_info;
  do {
    bytes_in_buffer = bytes_in_buffer + 1;
    _mp = (int *)((long)_mp + -1);
    if (cinfo->num_components <= (int)compptr) {
      cinfo->marker->saw_SOF = 1;
      pjVar3->next_input_byte = (JOCTET *)bytes_in_buffer;
      pjVar3->bytes_in_buffer = (size_t)_mp;
      return 1;
    }
    *(int *)((long)&datasrc->next_input_byte + 4) = (int)compptr;
    if (_mp == (int *)0x0) {
      bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar5 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar3->next_input_byte;
      _mp = (int *)pjVar3->bytes_in_buffer;
    }
    _mp = (int *)((long)_mp + -1);
    *(uint *)&datasrc->next_input_byte = (uint)*(byte *)bytes_in_buffer;
    bytes_in_buffer = bytes_in_buffer + 1;
    if (_mp == (int *)0x0) {
      bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar5 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar3->next_input_byte;
      _mp = (int *)pjVar3->bytes_in_buffer;
    }
    _mp = (int *)((long)_mp + -1);
    bVar1 = *(byte *)bytes_in_buffer;
    *(int *)&datasrc->bytes_in_buffer = (int)(uint)bVar1 >> 4;
    *(uint *)((long)&datasrc->bytes_in_buffer + 4) = bVar1 & 0xf;
    bytes_in_buffer = bytes_in_buffer + 1;
    if (_mp == (int *)0x0) {
      bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar5 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar3->next_input_byte;
      _mp = (int *)pjVar3->bytes_in_buffer;
    }
    *(uint *)&datasrc->init_source = (uint)*(byte *)bytes_in_buffer;
    pjVar4 = cinfo->err;
    (pjVar4->msg_parm).i[0] = *(int *)&datasrc->next_input_byte;
    (pjVar4->msg_parm).i[1] = (int)datasrc->bytes_in_buffer;
    (pjVar4->msg_parm).i[2] = *(int *)((long)&datasrc->bytes_in_buffer + 4);
    (pjVar4->msg_parm).i[3] = *(int *)&datasrc->init_source;
    cinfo->err->msg_code = 0x67;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    compptr._0_4_ = (int)compptr + 1;
    datasrc = (jpeg_source_mgr *)&datasrc[1].resync_to_restart;
  } while( true );
}

Assistant:

LOCAL(boolean)
get_sof (j_decompress_ptr cinfo, boolean is_baseline, boolean is_prog,
	 boolean is_arith)
/* Process a SOFn marker */
{
  INT32 length;
  int c, ci;
  jpeg_component_info * compptr;
  INPUT_VARS(cinfo);

  cinfo->is_baseline = is_baseline;
  cinfo->progressive_mode = is_prog;
  cinfo->arith_code = is_arith;

  INPUT_2BYTES(cinfo, length, return FALSE);

  INPUT_BYTE(cinfo, cinfo->data_precision, return FALSE);
  INPUT_2BYTES(cinfo, cinfo->image_height, return FALSE);
  INPUT_2BYTES(cinfo, cinfo->image_width, return FALSE);
  INPUT_BYTE(cinfo, cinfo->num_components, return FALSE);

  length -= 8;

  TRACEMS4(cinfo, 1, JTRC_SOF, cinfo->unread_marker,
	   (int) cinfo->image_width, (int) cinfo->image_height,
	   cinfo->num_components);

  if (cinfo->marker->saw_SOF)
    ERREXIT(cinfo, JERR_SOF_DUPLICATE);

  /* We don't support files in which the image height is initially specified */
  /* as 0 and is later redefined by DNL.  As long as we have to check that,  */
  /* might as well have a general sanity check. */
  if (cinfo->image_height <= 0 || cinfo->image_width <= 0
      || cinfo->num_components <= 0)
    ERREXIT(cinfo, JERR_EMPTY_IMAGE);

  if (length != (cinfo->num_components * 3))
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  if (cinfo->comp_info == NULL)	/* do only once, even if suspend */
    cinfo->comp_info = (jpeg_component_info *) (*cinfo->mem->alloc_small)
			((j_common_ptr) cinfo, JPOOL_IMAGE,
			 cinfo->num_components * SIZEOF(jpeg_component_info));
  
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    compptr->component_index = ci;
    INPUT_BYTE(cinfo, compptr->component_id, return FALSE);
    INPUT_BYTE(cinfo, c, return FALSE);
    compptr->h_samp_factor = (c >> 4) & 15;
    compptr->v_samp_factor = (c     ) & 15;
    INPUT_BYTE(cinfo, compptr->quant_tbl_no, return FALSE);

    TRACEMS4(cinfo, 1, JTRC_SOF_COMPONENT,
	     compptr->component_id, compptr->h_samp_factor,
	     compptr->v_samp_factor, compptr->quant_tbl_no);
  }

  cinfo->marker->saw_SOF = TRUE;

  INPUT_SYNC(cinfo);
  return TRUE;
}